

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O1

size_t ra_portable_serialize(roaring_array_t *ra,char *buf)

{
  byte *pbVar1;
  int iVar2;
  short sVar3;
  ulong uVar5;
  void *__src;
  ulong uVar6;
  int *piVar7;
  long lVar8;
  uint8_t uVar9;
  run_container_t *run;
  array_container_t *container;
  long lVar10;
  int iVar11;
  char *buf_00;
  bool bVar12;
  bool bVar13;
  int iVar4;
  
  uVar5 = (ulong)ra->size;
  bVar12 = 0 < (long)uVar5;
  if (0 < (long)uVar5) {
    bVar12 = true;
    uVar6 = 1;
    do {
      uVar9 = ra->typecodes[uVar6 - 1];
      if (uVar9 == '\x04') {
        uVar9 = *(uint8_t *)((long)ra->containers[uVar6 - 1] + 8);
      }
      if (uVar9 == '\x03') break;
      bVar12 = uVar6 < uVar5;
      bVar13 = uVar6 != uVar5;
      uVar6 = uVar6 + 1;
    } while (bVar13);
  }
  if (bVar12) {
    *(int32_t *)buf = ra->size * 0x10000 + -0xcfc5;
    iVar11 = ra->size + 7;
    iVar4 = ra->size + 0xe;
    if (-1 < iVar11) {
      iVar4 = iVar11;
    }
    uVar5 = (ulong)(uint)(iVar4 >> 3);
    __src = roaring_calloc(uVar5,1);
    if (0 < ra->size) {
      uVar6 = 0;
      do {
        uVar9 = ra->typecodes[uVar6];
        if (uVar9 == '\x04') {
          uVar9 = *(uint8_t *)((long)ra->containers[uVar6] + 8);
        }
        if (uVar9 == '\x03') {
          pbVar1 = (byte *)((long)__src + (uVar6 >> 3 & 0x1fffffff));
          *pbVar1 = *pbVar1 | '\x01' << ((byte)uVar6 & 7);
        }
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)ra->size);
    }
    memcpy(buf + 4,__src,uVar5);
    buf_00 = buf + 4 + uVar5;
    roaring_free(__src);
    iVar11 = ra->size;
    iVar2 = iVar11 * 8;
    if (iVar11 < 4) {
      iVar2 = iVar11 * 4;
    }
    iVar11 = iVar2 + 4 + (iVar4 >> 3);
  }
  else {
    buf[0] = ':';
    buf[1] = '0';
    buf[2] = '\0';
    buf[3] = '\0';
    *(int32_t *)(buf + 4) = ra->size;
    buf_00 = buf + 8;
    iVar11 = ra->size * 8 + 8;
  }
  if (ra->size < 1) {
    bVar13 = true;
  }
  else {
    lVar10 = 0;
    lVar8 = 0;
    do {
      *(uint16_t *)(buf_00 + lVar8 * 4) = ra->keys[lVar8];
      run = (run_container_t *)ra->containers[lVar8];
      uVar9 = ra->typecodes[lVar8];
      if (uVar9 == '\x04') {
        uVar9 = *(uint8_t *)&run->runs;
        run = *(run_container_t **)run;
      }
      if (uVar9 == '\x03') {
        iVar4 = run_container_cardinality(run);
        sVar3 = (short)iVar4;
      }
      else {
        sVar3 = (short)run->n_runs;
      }
      *(short *)(buf_00 + lVar8 * 4 + 2) = sVar3 + -1;
      lVar8 = lVar8 + 1;
      lVar10 = lVar10 + 4;
    } while (lVar8 < ra->size);
    bVar13 = ra->size < 4;
    buf_00 = buf_00 + lVar10;
  }
  if ((!(bool)(bVar12 & bVar13)) && (0 < ra->size)) {
    lVar8 = 0;
    lVar10 = 0;
    do {
      *(int *)(buf_00 + lVar10 * 4) = iVar11;
      piVar7 = (int *)ra->containers[lVar10];
      uVar9 = ra->typecodes[lVar10];
      if (uVar9 == '\x04') {
        uVar9 = (uint8_t)piVar7[2];
        piVar7 = *(int **)piVar7;
      }
      if (uVar9 == '\x01') {
        iVar4 = 0x2000;
      }
      else if (uVar9 == '\x03') {
        iVar4 = *piVar7 * 4 + 2;
      }
      else {
        iVar4 = *piVar7 * 2;
      }
      iVar11 = iVar11 + iVar4;
      lVar10 = lVar10 + 1;
      lVar8 = lVar8 + 4;
    } while (lVar10 < ra->size);
    buf_00 = buf_00 + lVar8;
  }
  if (0 < ra->size) {
    lVar8 = 0;
    do {
      container = (array_container_t *)ra->containers[lVar8];
      uVar9 = ra->typecodes[lVar8];
      if (uVar9 == '\x04') {
        uVar9 = *(uint8_t *)&container->array;
        container = *(array_container_t **)container;
      }
      if (uVar9 == '\x03') {
        iVar11 = run_container_write((run_container_t *)container,buf_00);
      }
      else if (uVar9 == '\x02') {
        iVar11 = array_container_write(container,buf_00);
      }
      else {
        iVar11 = bitset_container_write((bitset_container_t *)container,buf_00);
      }
      buf_00 = buf_00 + iVar11;
      lVar8 = lVar8 + 1;
    } while (lVar8 < ra->size);
  }
  return (long)buf_00 - (long)buf;
}

Assistant:

size_t ra_portable_serialize(const roaring_array_t *ra, char *buf) {
    char *initbuf = buf;
    uint32_t startOffset = 0;
    bool hasrun = ra_has_run_container(ra);
    if (hasrun) {
        uint32_t cookie = SERIAL_COOKIE | ((uint32_t)(ra->size - 1) << 16);
        memcpy(buf, &cookie, sizeof(cookie));
        buf += sizeof(cookie);
        uint32_t s = (ra->size + 7) / 8;
        uint8_t *bitmapOfRunContainers = (uint8_t *)roaring_calloc(s, 1);
        assert(bitmapOfRunContainers != NULL);  // todo: handle
        for (int32_t i = 0; i < ra->size; ++i) {
            if (get_container_type(ra->containers[i], ra->typecodes[i]) ==
                RUN_CONTAINER_TYPE) {
                bitmapOfRunContainers[i / 8] |= (1 << (i % 8));
            }
        }
        memcpy(buf, bitmapOfRunContainers, s);
        buf += s;
        roaring_free(bitmapOfRunContainers);
        if (ra->size < NO_OFFSET_THRESHOLD) {
            startOffset = 4 + 4 * ra->size + s;
        } else {
            startOffset = 4 + 8 * ra->size + s;
        }
    } else {  // backwards compatibility
        uint32_t cookie = SERIAL_COOKIE_NO_RUNCONTAINER;

        memcpy(buf, &cookie, sizeof(cookie));
        buf += sizeof(cookie);
        memcpy(buf, &ra->size, sizeof(ra->size));
        buf += sizeof(ra->size);

        startOffset = 4 + 4 + 4 * ra->size + 4 * ra->size;
    }
    for (int32_t k = 0; k < ra->size; ++k) {
        memcpy(buf, &ra->keys[k], sizeof(ra->keys[k]));
        buf += sizeof(ra->keys[k]);
        // get_cardinality returns a value in [1,1<<16], subtracting one
        // we get [0,1<<16 - 1] which fits in 16 bits
        uint16_t card = (uint16_t)(container_get_cardinality(ra->containers[k],
                                                             ra->typecodes[k]) -
                                   1);
        memcpy(buf, &card, sizeof(card));
        buf += sizeof(card);
    }
    if ((!hasrun) || (ra->size >= NO_OFFSET_THRESHOLD)) {
        // writing the containers offsets
        for (int32_t k = 0; k < ra->size; k++) {
            memcpy(buf, &startOffset, sizeof(startOffset));
            buf += sizeof(startOffset);
            startOffset =
                startOffset +
                container_size_in_bytes(ra->containers[k], ra->typecodes[k]);
        }
    }
    for (int32_t k = 0; k < ra->size; ++k) {
        buf += container_write(ra->containers[k], ra->typecodes[k], buf);
    }
    return buf - initbuf;
}